

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.cpp
# Opt level: O0

void test_qclab_dense_memory<std::complex<double>>(void)

{
  bool bVar1;
  type pcVar2;
  char *pcVar3;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  complex<double> value;
  complex<double> value_00;
  complex<double> value_01;
  AssertHelper local_328;
  Message local_320;
  complex<double> local_318;
  undefined1 local_308 [8];
  AssertionResult gtest_ar_11;
  int64_t i_2;
  unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> local_2e0;
  unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> init10;
  Message local_2d0;
  complex<double> local_2c8;
  undefined1 local_2b8 [8];
  AssertionResult gtest_ar_10;
  Message local_2a0;
  complex<double> local_298;
  undefined1 local_288 [8];
  AssertionResult gtest_ar_9;
  unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> local_268;
  unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> init2;
  Message local_258;
  complex<double> local_250;
  undefined1 local_240 [8];
  AssertionResult gtest_ar_8;
  unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> local_220;
  unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> init1;
  Message local_210;
  complex<double> local_208;
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar_7;
  int64_t i_1;
  unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> mem10;
  Message local_1d0;
  complex<double> local_1c8;
  undefined1 local_1b8 [8];
  AssertionResult gtest_ar_6;
  Message local_1a0;
  complex<double> local_198;
  undefined1 local_188 [8];
  AssertionResult gtest_ar_5;
  unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> mem2;
  Message local_168;
  complex<double> local_160;
  undefined1 local_150 [8];
  AssertionResult gtest_ar_4;
  unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> mem1;
  Message local_130;
  complex<double> local_128;
  undefined1 local_118 [8];
  AssertionResult gtest_ar_3;
  undefined8 uStack_100;
  size_t local_f8;
  int64_t i;
  unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> alloc10;
  Message local_e0;
  complex<double> local_d8;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar_2;
  Message local_b0;
  complex<double> local_a8;
  undefined1 local_98 [8];
  AssertionResult gtest_ar_1;
  undefined8 uStack_80;
  complex<double> local_78;
  unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> local_68;
  unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> alloc2;
  Message local_58;
  complex<double> local_50;
  undefined1 local_40 [8];
  AssertionResult gtest_ar;
  complex<double> local_20;
  unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> local_10;
  unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> alloc1;
  
  qclab::dense::alloc_unique_array<std::complex<double>>((dense *)&local_10,1);
  std::complex<double>::complex(&local_20,5.0,0.0);
  pcVar2 = std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::
           operator[](&local_10,0);
  *(undefined8 *)pcVar2->_M_value = local_20._M_value._0_8_;
  *(undefined8 *)(pcVar2->_M_value + 8) = local_20._M_value._8_8_;
  pcVar2 = std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::
           operator[](&local_10,0);
  std::complex<double>::complex(&local_50,5.0,0.0);
  testing::internal::EqHelper::Compare<std::complex<double>,_std::complex<double>,_nullptr>
            ((EqHelper *)local_40,"alloc1[0]","T(5)",pcVar2,&local_50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    testing::Message::Message(&local_58);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_40);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&alloc2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/memory.cpp"
               ,0xb,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&alloc2,&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&alloc2);
    testing::Message::~Message(&local_58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  qclab::dense::alloc_unique_array<std::complex<double>>((dense *)&local_68,2);
  std::complex<double>::complex(&local_78,5.0,0.0);
  pcVar2 = std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::
           operator[](&local_68,0);
  *(undefined8 *)pcVar2->_M_value = local_78._M_value._0_8_;
  *(undefined8 *)(pcVar2->_M_value + 8) = local_78._M_value._8_8_;
  std::complex<double>::complex((complex<double> *)&gtest_ar_1.message_,6.0,0.0);
  pcVar2 = std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::
           operator[](&local_68,1);
  *(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
    *)pcVar2->_M_value =
       gtest_ar_1.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  *(undefined8 *)(pcVar2->_M_value + 8) = uStack_80;
  pcVar2 = std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::
           operator[](&local_68,0);
  std::complex<double>::complex(&local_a8,5.0,0.0);
  testing::internal::EqHelper::Compare<std::complex<double>,_std::complex<double>,_nullptr>
            ((EqHelper *)local_98,"alloc2[0]","T(5)",pcVar2,&local_a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(&local_b0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/memory.cpp"
               ,0x10,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  pcVar2 = std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::
           operator[](&local_68,1);
  std::complex<double>::complex(&local_d8,6.0,0.0);
  testing::internal::EqHelper::Compare<std::complex<double>,_std::complex<double>,_nullptr>
            ((EqHelper *)local_c8,"alloc2[1]","T(6)",pcVar2,&local_d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    testing::Message::Message(&local_e0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&alloc10,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/memory.cpp"
               ,0x11,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&alloc10,&local_e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&alloc10);
    testing::Message::~Message(&local_e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  qclab::dense::alloc_unique_array<std::complex<double>>((dense *)&i,10);
  for (local_f8 = 0; (long)local_f8 < 1; local_f8 = local_f8 + 1) {
    std::complex<double>::complex
              ((complex<double> *)&gtest_ar_3.message_,(double)(long)local_f8,0.0);
    pcVar2 = std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::
             operator[]((unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>
                         *)&i,local_f8);
    *(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
      *)pcVar2->_M_value =
         gtest_ar_3.message_._M_t.
         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
    *(undefined8 *)(pcVar2->_M_value + 8) = uStack_100;
    pcVar2 = std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::
             operator[]((unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>
                         *)&i,local_f8);
    std::complex<double>::complex(&local_128,(double)(long)local_f8,0.0);
    testing::internal::EqHelper::Compare<std::complex<double>,_std::complex<double>,_nullptr>
              ((EqHelper *)local_118,"alloc10[i]","T(i)",pcVar2,&local_128);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
    if (!bVar1) {
      testing::Message::Message(&local_130);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_118);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&mem1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/memory.cpp"
                 ,0x16,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&mem1,&local_130);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mem1);
      testing::Message::~Message(&local_130);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
  }
  qclab::dense::init_unique_array<std::complex<double>>((dense *)&gtest_ar_4.message_,1);
  pcVar2 = std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::
           operator[]((unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>
                       *)&gtest_ar_4.message_,0);
  std::complex<double>::complex(&local_160,0.0,0.0);
  testing::internal::EqHelper::Compare<std::complex<double>,_std::complex<double>,_nullptr>
            ((EqHelper *)local_150,"mem1[0]","T(0)",pcVar2,&local_160);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
  if (!bVar1) {
    testing::Message::Message(&local_168);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_150);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&mem2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/memory.cpp"
               ,0x1b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&mem2,&local_168);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mem2);
    testing::Message::~Message(&local_168);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
  qclab::dense::init_unique_array<std::complex<double>>((dense *)&gtest_ar_5.message_,2);
  pcVar2 = std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::
           operator[]((unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>
                       *)&gtest_ar_5.message_,0);
  std::complex<double>::complex(&local_198,0.0,0.0);
  testing::internal::EqHelper::Compare<std::complex<double>,_std::complex<double>,_nullptr>
            ((EqHelper *)local_188,"mem2[0]","T(0)",pcVar2,&local_198);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_188);
  if (!bVar1) {
    testing::Message::Message(&local_1a0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_188);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/memory.cpp"
               ,0x1e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_1a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_1a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_188);
  pcVar2 = std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::
           operator[]((unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>
                       *)&gtest_ar_5.message_,1);
  std::complex<double>::complex(&local_1c8,0.0,0.0);
  testing::internal::EqHelper::Compare<std::complex<double>,_std::complex<double>,_nullptr>
            ((EqHelper *)local_1b8,"mem2[1]","T(0)",pcVar2,&local_1c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b8);
  if (!bVar1) {
    testing::Message::Message(&local_1d0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&mem10,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/memory.cpp"
               ,0x1f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&mem10,&local_1d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mem10);
    testing::Message::~Message(&local_1d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b8);
  qclab::dense::init_unique_array<std::complex<double>>((dense *)&i_1,10);
  for (gtest_ar_7.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl =
            (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
             )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0;
      (long)gtest_ar_7.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl < 1;
      gtest_ar_7.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )((long)gtest_ar_7.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl + 1)) {
    pcVar2 = std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::
             operator[]((unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>
                         *)&i_1,(size_t)gtest_ar_7.message_._M_t.
                                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                        ._M_head_impl);
    std::complex<double>::complex(&local_208,0.0,0.0);
    testing::internal::EqHelper::Compare<std::complex<double>,_std::complex<double>,_nullptr>
              ((EqHelper *)local_1f8,"mem10[i]","T(0)",pcVar2,&local_208);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
    if (!bVar1) {
      testing::Message::Message(&local_210);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1f8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&init1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/memory.cpp"
                 ,0x23,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&init1,&local_210);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&init1);
      testing::Message::~Message(&local_210);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
  }
  std::complex<double>::complex((complex<double> *)&gtest_ar_8.message_,3.14,0.0);
  value._M_value._8_8_ = extraout_RDX;
  value._M_value._0_8_ = 1;
  qclab::dense::init_unique_array<std::complex<double>>((int64_t)&local_220,value);
  pcVar2 = std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::
           operator[](&local_220,0);
  std::complex<double>::complex(&local_250,3.14,0.0);
  testing::internal::EqHelper::Compare<std::complex<double>,_std::complex<double>,_nullptr>
            ((EqHelper *)local_240,"init1[0]","T(3.14)",pcVar2,&local_250);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_240);
  if (!bVar1) {
    testing::Message::Message(&local_258);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_240);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&init2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/memory.cpp"
               ,0x28,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&init2,&local_258);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&init2);
    testing::Message::~Message(&local_258);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_240);
  std::complex<double>::complex((complex<double> *)&gtest_ar_9.message_,3.14,0.0);
  value_00._M_value._8_8_ = extraout_RDX_00;
  value_00._M_value._0_8_ = 2;
  qclab::dense::init_unique_array<std::complex<double>>((int64_t)&local_268,value_00);
  pcVar2 = std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::
           operator[](&local_268,0);
  std::complex<double>::complex(&local_298,3.14,0.0);
  testing::internal::EqHelper::Compare<std::complex<double>,_std::complex<double>,_nullptr>
            ((EqHelper *)local_288,"init2[0]","T(3.14)",pcVar2,&local_298);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_288);
  if (!bVar1) {
    testing::Message::Message(&local_2a0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_288);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/memory.cpp"
               ,0x2b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_2a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_2a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_288);
  pcVar2 = std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::
           operator[](&local_268,1);
  std::complex<double>::complex(&local_2c8,3.14,0.0);
  testing::internal::EqHelper::Compare<std::complex<double>,_std::complex<double>,_nullptr>
            ((EqHelper *)local_2b8,"init2[1]","T(3.14)",pcVar2,&local_2c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b8);
  if (!bVar1) {
    testing::Message::Message(&local_2d0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&init10,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/memory.cpp"
               ,0x2c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&init10,&local_2d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&init10);
    testing::Message::~Message(&local_2d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b8);
  std::complex<double>::complex((complex<double> *)&i_2,3.14,0.0);
  value_01._M_value._8_8_ = extraout_RDX_01;
  value_01._M_value._0_8_ = 10;
  qclab::dense::init_unique_array<std::complex<double>>((int64_t)&local_2e0,value_01);
  for (gtest_ar_11.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl =
            (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
             )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0;
      (long)gtest_ar_11.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl < 1;
      gtest_ar_11.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )((long)gtest_ar_11.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl + 1)) {
    pcVar2 = std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::
             operator[](&local_2e0,
                        (size_t)gtest_ar_11.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl);
    std::complex<double>::complex(&local_318,3.14,0.0);
    testing::internal::EqHelper::Compare<std::complex<double>,_std::complex<double>,_nullptr>
              ((EqHelper *)local_308,"init10[i]","T(3.14)",pcVar2,&local_318);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_308);
    if (!bVar1) {
      testing::Message::Message(&local_320);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_308);
      testing::internal::AssertHelper::AssertHelper
                (&local_328,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/memory.cpp"
                 ,0x30,pcVar3);
      testing::internal::AssertHelper::operator=(&local_328,&local_320);
      testing::internal::AssertHelper::~AssertHelper(&local_328);
      testing::Message::~Message(&local_320);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_308);
  }
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            (&local_2e0);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            (&local_268);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            (&local_220);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> *)
             &i_1);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> *)
             &gtest_ar_5.message_);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> *)
             &gtest_ar_4.message_);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> *)&i)
  ;
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            (&local_68);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            (&local_10);
  return;
}

Assistant:

void test_qclab_dense_memory() {

  // alloc_unique_array
  std::unique_ptr< T[] >  alloc1 = qclab::dense::alloc_unique_array< T >( 1 ) ;
  alloc1[0] = T(5) ;
  EXPECT_EQ( alloc1[0] , T(5) ) ;

  std::unique_ptr< T[] >  alloc2 = qclab::dense::alloc_unique_array< T >( 2 ) ;
  alloc2[0] = T(5) ;
  alloc2[1] = T(6) ;
  EXPECT_EQ( alloc2[0] , T(5) ) ;
  EXPECT_EQ( alloc2[1] , T(6) ) ;

  std::unique_ptr< T[] >  alloc10 = qclab::dense::alloc_unique_array< T >( 10 );
  for ( int64_t i = 0; i < 1; i++ ) {
    alloc10[i] = T(i) ;
    EXPECT_EQ( alloc10[i] , T(i) ) ;
  }

  // init_unique_array (zero)
  std::unique_ptr< T[] >  mem1 = qclab::dense::init_unique_array< T >( 1 ) ;
  EXPECT_EQ( mem1[0] , T(0) ) ;

  std::unique_ptr< T[] >  mem2 = qclab::dense::init_unique_array< T >( 2 ) ;
  EXPECT_EQ( mem2[0] , T(0) ) ;
  EXPECT_EQ( mem2[1] , T(0) ) ;

  std::unique_ptr< T[] >  mem10 = qclab::dense::init_unique_array< T >( 10 ) ;
  for ( int64_t i = 0; i < 1; i++ ) {
    EXPECT_EQ( mem10[i] , T(0) ) ;
  }

  // init_unique_array (zero)
  auto init1 = qclab::dense::init_unique_array< T >( 1 , T(3.14) ) ;
  EXPECT_EQ( init1[0] , T(3.14) ) ;

  auto init2 = qclab::dense::init_unique_array< T >( 2 , T(3.14) ) ;
  EXPECT_EQ( init2[0] , T(3.14) ) ;
  EXPECT_EQ( init2[1] , T(3.14) ) ;

  auto init10 = qclab::dense::init_unique_array< T >( 10 , T(3.14) ) ;
  for ( int64_t i = 0; i < 1; i++ ) {
    EXPECT_EQ( init10[i] , T(3.14) ) ;
  }

}